

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_192_192_4_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0x10] = '\0';
  local_18[0x11] = '\0';
  local_18[0x12] = '\0';
  local_18[0x13] = '\0';
  local_18[0x14] = '\0';
  local_18[0x15] = '\0';
  local_18[0x16] = '\0';
  local_18[0x17] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_58[0x10] = 'x';
  local_58[0x11] = '3';
  local_58[0x12] = '\a';
  local_58[0x13] = 'f';
  local_58[0x14] = 'S';
  local_58[0x15] = 0xba;
  local_58[0x16] = '+';
  local_58[0x17] = ')';
  local_18[0] = 0x80;
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  local_18[8] = '\0';
  local_18[9] = '\0';
  local_18[10] = '\0';
  local_18[0xb] = '\0';
  local_18[0xc] = '\0';
  local_18[0xd] = '\0';
  local_18[0xe] = '\0';
  local_18[0xf] = '\0';
  local_38[0] = 0xab;
  local_38[1] = 0xff;
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_58[0] = 0xf8;
  local_58[1] = 0xf7;
  local_58[2] = 0xa2;
  local_58[3] = '%';
  local_58[4] = 0xde;
  local_58[5] = 'w';
  local_58[6] = '\x12';
  local_58[7] = '1';
  local_58[8] = ')';
  local_58[9] = '\x10';
  local_58[10] = 'z';
  local_58[0xb] = ' ';
  local_58[0xc] = 0xf5;
  local_58[0xd] = 'T';
  local_58[0xe] = ':';
  local_58[0xf] = 0xfa;
  iVar1 = lowmc_enc(&parameters_192_192_4,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_1(void) {
  const uint8_t key[24] = {
      0x80, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
      0x0,  0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
  };
  const uint8_t plaintext[24] = {
      0xab, 0xff, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
      0x0,  0x0,  0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
  };
  const uint8_t ciphertext_expected[24] = {
      0xf8, 0xf7, 0xa2, 0x25, 0xde, 0x77, 0x12, 0x31, 0x29, 0x10, 0x7a, 0x20,
      0xf5, 0x54, 0x3a, 0xfa, 0x78, 0x33, 0x7,  0x66, 0x53, 0xba, 0x2b, 0x29,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}